

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O0

void lib::math::RegisterLibMath(State *state)

{
  State *in_RDI;
  TableMemberReg math [29];
  Library lib;
  char *in_stack_fffffffffffffd28;
  anon_union_8_3_6606d591_for_TableMemberReg_1 in_stack_fffffffffffffd30;
  TableMemberReg TStack_2c0;
  TableMemberReg TStack_2a8;
  TableMemberReg TStack_290;
  TableMemberReg TStack_278;
  TableMemberReg TStack_260;
  TableMemberReg TStack_248;
  TableMemberReg TStack_230;
  TableMemberReg TStack_218;
  TableMemberReg TStack_200;
  TableMemberReg TStack_1e8;
  TableMemberReg TStack_1d0;
  TableMemberReg TStack_1b8;
  TableMemberReg TStack_1a0;
  TableMemberReg TStack_188;
  TableMemberReg TStack_170;
  TableMemberReg TStack_158;
  TableMemberReg TStack_140;
  TableMemberReg TStack_128;
  TableMemberReg TStack_110;
  TableMemberReg TStack_f8;
  TableMemberReg TStack_e0;
  TableMemberReg TStack_c8;
  TableMemberReg TStack_b0;
  TableMemberReg TStack_98;
  TableMemberReg TStack_80;
  TableMemberReg TStack_68;
  TableMemberReg TStack_50;
  TableMemberReg TStack_38;
  Library local_18;
  
  luna::Library::Library(&local_18,in_RDI);
  luna::TableMemberReg::TableMemberReg((TableMemberReg *)&stack0xfffffffffffffd28,"abs",Abs);
  luna::TableMemberReg::TableMemberReg(&TStack_2c0,"acos",Acos);
  luna::TableMemberReg::TableMemberReg(&TStack_2a8,"asin",Asin);
  luna::TableMemberReg::TableMemberReg(&TStack_290,"atan",Atan);
  luna::TableMemberReg::TableMemberReg(&TStack_278,"atan2",Atan2);
  luna::TableMemberReg::TableMemberReg(&TStack_260,"ceil",Ceil);
  luna::TableMemberReg::TableMemberReg(&TStack_248,"cos",Cos);
  luna::TableMemberReg::TableMemberReg(&TStack_230,"cosh",Cosh);
  luna::TableMemberReg::TableMemberReg(&TStack_218,"deg",Deg);
  luna::TableMemberReg::TableMemberReg(&TStack_200,"exp",Exp);
  luna::TableMemberReg::TableMemberReg(&TStack_1e8,"floor",Floor);
  luna::TableMemberReg::TableMemberReg(&TStack_1d0,"fmod",Fmod);
  luna::TableMemberReg::TableMemberReg(&TStack_1b8,"frexp",Frexp);
  luna::TableMemberReg::TableMemberReg(&TStack_1a0,"ldexp",Ldexp);
  luna::TableMemberReg::TableMemberReg(&TStack_188,"log",Log);
  luna::TableMemberReg::TableMemberReg(&TStack_170,"max",Max);
  luna::TableMemberReg::TableMemberReg(&TStack_158,"min",Min);
  luna::TableMemberReg::TableMemberReg(&TStack_140,"modf",Modf);
  luna::TableMemberReg::TableMemberReg(&TStack_128,"pow",Pow);
  luna::TableMemberReg::TableMemberReg(&TStack_110,"rad",Rad);
  luna::TableMemberReg::TableMemberReg(&TStack_f8,"random",Random);
  luna::TableMemberReg::TableMemberReg(&TStack_e0,"randomseed",RandomSeed);
  luna::TableMemberReg::TableMemberReg(&TStack_c8,"sin",Sin);
  luna::TableMemberReg::TableMemberReg(&TStack_b0,"sinh",Sinh);
  luna::TableMemberReg::TableMemberReg(&TStack_98,"sqrt",Sqrt);
  luna::TableMemberReg::TableMemberReg(&TStack_80,"tan",Tan);
  luna::TableMemberReg::TableMemberReg(&TStack_68,"tanh",Tanh);
  luna::TableMemberReg::TableMemberReg(&TStack_50,"huge",INFINITY);
  luna::TableMemberReg::TableMemberReg(&TStack_38,"pi",3.141592653589793);
  luna::Library::RegisterTableFunction<29ul>
            ((Library *)in_stack_fffffffffffffd30.func_,in_stack_fffffffffffffd28,
             (TableMemberReg (*) [29])0x166140);
  return;
}

Assistant:

void RegisterLibMath(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg math[] = {
            { "abs", Abs },
            { "acos", Acos },
            { "asin", Asin },
            { "atan", Atan },
            { "atan2", Atan2 },
            { "ceil", Ceil },
            { "cos", Cos },
            { "cosh", Cosh },
            { "deg", Deg },
            { "exp", Exp },
            { "floor", Floor },
            { "fmod", Fmod },
            { "frexp", Frexp },
            { "ldexp", Ldexp },
            { "log", Log },
            { "max", Max },
            { "min", Min },
            { "modf", Modf },
            { "pow", Pow },
            { "rad", Rad },
            { "random", Random },
            { "randomseed", RandomSeed },
            { "sin", Sin },
            { "sinh", Sinh },
            { "sqrt", Sqrt },
            { "tan", Tan },
            { "tanh", Tanh },
            { "huge", HUGE_VAL },
            { "pi", M_PI }
        };

        lib.RegisterTableFunction("math", math);
    }